

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O3

MemoryRegionSection *
address_space_translate_iommu
          (MemoryRegionSection *__return_storage_ptr__,IOMMUMemoryRegion *iommu_mr,hwaddr *xlat,
          hwaddr *plen_out,hwaddr *page_mask_out,_Bool is_write,_Bool is_mmio,
          AddressSpace **target_as,MemTxAttrs attrs)

{
  _func_int_IOMMUMemoryRegion_ptr_MemTxAttrs *p_Var1;
  undefined8 uVar2;
  FlatView *pFVar3;
  hwaddr hVar4;
  hwaddr hVar5;
  undefined8 uVar6;
  Int128 IVar7;
  undefined7 uVar8;
  int iVar9;
  MemoryRegionSection *pMVar10;
  MemoryRegion *pMVar11;
  ulong uVar12;
  undefined7 in_register_00000089;
  ulong addr;
  IOMMUMemoryRegion *pIVar13;
  MemTxAttrs in_stack_ffffffffffffff88;
  IOMMUTLBEntry local_58;
  
  pIVar13 = iommu_mr;
  do {
    uVar12 = *xlat;
    p_Var1 = (pIVar13->cc).attrs_to_index;
    if (p_Var1 == (_func_int_IOMMUMemoryRegion_ptr_MemTxAttrs *)0x0) {
      iVar9 = 0;
    }
    else {
      iVar9 = (*p_Var1)(pIVar13,in_stack_ffffffffffffff88);
    }
    (*(pIVar13->cc).translate)(&local_58,pIVar13,uVar12,(int)page_mask_out + IOMMU_RO,iVar9);
    if ((local_58.perm & 1 << ((byte)page_mask_out & 0x1f)) == IOMMU_NONE) {
      *(undefined8 *)&__return_storage_ptr__->readonly = 0;
      *(undefined8 *)&__return_storage_ptr__->field_0x38 = 0;
      __return_storage_ptr__->offset_within_region = 0;
      __return_storage_ptr__->offset_within_address_space = 0;
      __return_storage_ptr__->mr = (MemoryRegion *)0x0;
      __return_storage_ptr__->fv = (FlatView *)0x0;
      *(undefined8 *)&__return_storage_ptr__->size = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->size + 8) = 0;
      pMVar11 = &((iommu_mr->parent_obj).uc)->io_mem_unassigned;
      __return_storage_ptr__->mr = pMVar11;
      return (MemoryRegionSection *)pMVar11;
    }
    addr = (uVar12 ^ local_58.translated_addr) & local_58.addr_mask ^ local_58.translated_addr;
    uVar12 = ((local_58.addr_mask | local_58.translated_addr) - addr) + 1;
    if (*plen_out < uVar12) {
      uVar12 = *plen_out;
    }
    *plen_out = uVar12;
    *(AddressSpace **)CONCAT71(in_register_00000089,is_write) = local_58.target_as;
    pMVar10 = address_space_translate_internal
                        ((local_58.target_as)->current_map->dispatch,addr,xlat,plen_out,true);
    pIVar13 = (IOMMUMemoryRegion *)pMVar10->mr;
  } while ((pIVar13 != (IOMMUMemoryRegion *)0x0) && ((pIVar13->parent_obj).is_iommu != false));
  IVar7 = pMVar10->size;
  uVar2 = *(undefined8 *)((long)&pMVar10->size + 8);
  pMVar11 = pMVar10->mr;
  pFVar3 = pMVar10->fv;
  hVar4 = pMVar10->offset_within_region;
  hVar5 = pMVar10->offset_within_address_space;
  uVar8 = *(undefined7 *)&pMVar10->field_0x31;
  uVar6 = *(undefined8 *)&pMVar10->field_0x38;
  __return_storage_ptr__->readonly = pMVar10->readonly;
  *(undefined7 *)&__return_storage_ptr__->field_0x31 = uVar8;
  *(undefined8 *)&__return_storage_ptr__->field_0x38 = uVar6;
  __return_storage_ptr__->offset_within_region = hVar4;
  __return_storage_ptr__->offset_within_address_space = hVar5;
  __return_storage_ptr__->mr = pMVar11;
  __return_storage_ptr__->fv = pFVar3;
  *(long *)&__return_storage_ptr__->size = (long)IVar7;
  *(undefined8 *)((long)&__return_storage_ptr__->size + 8) = uVar2;
  return pMVar10;
}

Assistant:

static MemoryRegionSection address_space_translate_iommu(IOMMUMemoryRegion *iommu_mr,
                                                         hwaddr *xlat,
                                                         hwaddr *plen_out,
                                                         hwaddr *page_mask_out,
                                                         bool is_write,
                                                         bool is_mmio,
                                                         AddressSpace **target_as,
                                                         MemTxAttrs attrs)
{
    MemoryRegionSection *section;
    hwaddr page_mask = (hwaddr)-1;
    MemoryRegion *mr = MEMORY_REGION(iommu_mr);

    do {
        hwaddr addr = *xlat;
        IOMMUMemoryRegionClass *imrc = memory_region_get_iommu_class_nocheck(iommu_mr);
        int iommu_idx = 0;
        IOMMUTLBEntry iotlb;

        if (imrc->attrs_to_index) {
            iommu_idx = imrc->attrs_to_index(iommu_mr, attrs);
        }

        iotlb = imrc->translate(iommu_mr, addr, is_write ?
                                IOMMU_WO : IOMMU_RO, iommu_idx);

        if (!(iotlb.perm & (1 << is_write))) {
            goto unassigned;
        }

        addr = ((iotlb.translated_addr & ~iotlb.addr_mask)
                | (addr & iotlb.addr_mask));
        page_mask &= iotlb.addr_mask;
        *plen_out = MIN(*plen_out, (addr | iotlb.addr_mask) - addr + 1);
        *target_as = iotlb.target_as;

        section = address_space_translate_internal(
                address_space_to_dispatch(iotlb.target_as), addr, xlat,
                plen_out, is_mmio);

        iommu_mr = memory_region_get_iommu(section->mr);
    } while (unlikely(iommu_mr));

    if (page_mask_out) {
        *page_mask_out = page_mask;
    }
    return *section;

unassigned:
    return (MemoryRegionSection) { .mr = &(mr->uc->io_mem_unassigned) };
}